

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute.c
# Opt level: O2

int flute_wl(int d,int *x,int *y,int acc)

{
  int iVar1;
  point *ppVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  point *ppVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  point *ptp [150];
  int s [150];
  int ys [150];
  int xs [150];
  point pt [150];
  
  if (d == 2) {
    iVar4 = *x - x[1];
    iVar6 = -iVar4;
    if (0 < iVar4) {
      iVar6 = iVar4;
    }
    iVar11 = *y - y[1];
    iVar4 = -iVar11;
    if (0 < iVar11) {
      iVar4 = iVar11;
    }
    return iVar4 + iVar6;
  }
  if (d == 3) {
    iVar6 = *x;
    iVar4 = x[1];
    iVar11 = iVar4;
    if (iVar4 < iVar6) {
      iVar11 = iVar6;
    }
    if (iVar6 < iVar4) {
      iVar4 = iVar6;
    }
    iVar6 = x[2];
    if (iVar11 <= iVar6) {
      iVar11 = iVar6;
    }
    if (iVar6 <= iVar4) {
      iVar4 = iVar6;
    }
    iVar6 = *y;
    iVar1 = y[1];
    iVar3 = iVar1;
    if (iVar1 < iVar6) {
      iVar3 = iVar6;
    }
    if (iVar6 < iVar1) {
      iVar1 = iVar6;
    }
    iVar6 = y[2];
    if (iVar3 <= iVar6) {
      iVar3 = iVar6;
    }
    if (iVar6 <= iVar1) {
      iVar1 = iVar6;
    }
    return (iVar3 + iVar11) - (iVar1 + iVar4);
  }
  uVar7 = 0;
  uVar13 = 0;
  if (0 < d) {
    uVar13 = (ulong)(uint)d;
  }
  ppVar8 = pt;
  for (; uVar13 != uVar7; uVar7 = uVar7 + 1) {
    ppVar8->x = x[uVar7];
    ppVar8->y = y[uVar7];
    ptp[uVar7] = ppVar8;
    ppVar8 = ppVar8 + 1;
  }
  uVar5 = d - 1;
  uVar9 = 0;
  uVar7 = 0;
  if (0 < (int)uVar5) {
    uVar7 = (ulong)uVar5;
  }
  uVar12 = 1;
  for (; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    ppVar8 = ptp[uVar9];
    iVar6 = ppVar8->x;
    uVar10 = uVar9 & 0xffffffff;
    for (uVar14 = uVar12; (int)uVar14 < d; uVar14 = uVar14 + 1) {
      iVar4 = ptp[uVar14]->x;
      if (iVar4 < iVar6) {
        uVar10 = uVar14 & 0xffffffff;
      }
      if (iVar4 <= iVar6) {
        iVar6 = iVar4;
      }
    }
    ptp[uVar9] = ptp[(int)uVar10];
    ptp[(int)uVar10] = ppVar8;
    uVar12 = uVar12 + 1;
  }
  for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
    ppVar8 = ptp[uVar9];
    xs[uVar9] = ppVar8->x;
    ppVar8->o = (int)uVar9;
  }
  uVar13 = 1;
  for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    ppVar8 = ptp[uVar9];
    iVar6 = ppVar8->y;
    uVar14 = uVar9 & 0xffffffff;
    for (uVar12 = uVar13; (int)uVar12 < d; uVar12 = uVar12 + 1) {
      iVar4 = ptp[uVar12]->y;
      if (iVar4 < iVar6) {
        uVar14 = uVar12 & 0xffffffff;
      }
      if (iVar4 <= iVar6) {
        iVar6 = iVar4;
      }
    }
    ppVar2 = ptp[(int)uVar14];
    ys[uVar9] = ppVar2->y;
    s[uVar9] = ppVar2->o;
    ptp[(int)uVar14] = ppVar8;
    uVar13 = uVar13 + 1;
  }
  ppVar8 = ptp[(int)uVar5];
  ys[(int)uVar5] = ppVar8->y;
  s[(int)uVar5] = ppVar8->o;
  if (d < 10) {
    iVar6 = flutes_wl_LD(d,xs,ys,s);
  }
  else {
    iVar6 = flutes_wl_MD(d,xs,ys,s,acc);
  }
  return iVar6;
}

Assistant:

DTYPE flute_wl(int d, DTYPE x[], DTYPE y[], int acc)
{
    DTYPE xs[MAXD], ys[MAXD], minval, l, xu, xl, yu, yl;
    int s[MAXD];
    int i, j, k, minidx;
    struct point pt[MAXD], *ptp[MAXD], *tmpp;

    if (d==2)
        l = ADIFF(x[0], x[1]) + ADIFF(y[0], y[1]);
    else if (d==3) {
        if (x[0] > x[1]) {
            xu = max(x[0], x[2]);
            xl = min(x[1], x[2]);
        }
        else {
            xu = max(x[1], x[2]);
            xl = min(x[0], x[2]);
        }
        if (y[0] > y[1]) {
            yu = max(y[0], y[2]);
            yl = min(y[1], y[2]);
        }
        else {
            yu = max(y[1], y[2]);
            yl = min(y[0], y[2]);
        }
        l = (xu-xl) + (yu-yl);
    }
    else {
        for (i=0; i<d; i++) {
            pt[i].x = x[i];
            pt[i].y = y[i];
            ptp[i] = &pt[i];
        }
        
        // sort x
        for (i=0; i<d-1; i++) {
            minval = ptp[i]->x;
            minidx = i;
            for (j=i+1; j<d; j++) {
                if (minval > ptp[j]->x) {
                    minval = ptp[j]->x;
                    minidx = j;
                }
            }
            tmpp = ptp[i];
            ptp[i] = ptp[minidx];
            ptp[minidx] = tmpp;
        }

#if REMOVE_DUPLICATE_PIN==1
        ptp[d] = &pt[d];
        ptp[d]->x = ptp[d]->y = -999999;
        j = 0;
        for (i=0; i<d; i++) {
            for (k=i+1; ptp[k]->x == ptp[i]->x; k++)
                if (ptp[k]->y == ptp[i]->y)  // pins k and i are the same
                    break;
            if (ptp[k]->x != ptp[i]->x)
                ptp[j++] = ptp[i];
        }
        d = j;
#endif
        
        for (i=0; i<d; i++) {
            xs[i] = ptp[i]->x;
            ptp[i]->o = i;
        }

        // sort y to find s[]
        for (i=0; i<d-1; i++) {
            minval = ptp[i]->y;
            minidx = i;
            for (j=i+1; j<d; j++) {
                if (minval > ptp[j]->y) {
                    minval = ptp[j]->y;
                    minidx = j;
                }
            }
            ys[i] = ptp[minidx]->y;
            s[i] = ptp[minidx]->o;
            ptp[minidx] = ptp[i];
        }
        ys[d-1] = ptp[d-1]->y;
        s[d-1] = ptp[d-1]->o;
        
        l = flutes_wl(d, xs, ys, s, acc);
    }
    return l;
}